

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O0

void duckdb::AggregateExecutor::
     Combine<duckdb::ArgMinMaxState<int,int>,duckdb::ArgMinMaxBase<duckdb::GreaterThan,true>>
               (Vector *source,Vector *target,AggregateInputData *aggr_input_data,idx_t count)

{
  ArgMinMaxState<int,_int> *source_00;
  ArgMinMaxState<int,_int> *in_RCX;
  idx_t i;
  ArgMinMaxState<int,_int> **tdata;
  ArgMinMaxState<int,_int> **sdata;
  ArgMinMaxState<int,_int> *target_00;
  
  FlatVector::GetData<duckdb::ArgMinMaxState<int,int>const*>((Vector *)0x8bff02);
  source_00 = (ArgMinMaxState<int,_int> *)
              FlatVector::GetData<duckdb::ArgMinMaxState<int,int>*>((Vector *)0x8bff11);
  for (target_00 = (ArgMinMaxState<int,_int> *)0x0; target_00 < in_RCX;
      target_00 = (ArgMinMaxState<int,_int> *)&(target_00->super_ArgMinMaxStateBase).arg_null) {
    ArgMinMaxBase<duckdb::GreaterThan,true>::
    Combine<duckdb::ArgMinMaxState<int,int>,duckdb::ArgMinMaxBase<duckdb::GreaterThan,true>>
              (source_00,target_00,(AggregateInputData *)0x8bff4d);
  }
  return;
}

Assistant:

static void Combine(Vector &source, Vector &target, AggregateInputData &aggr_input_data, idx_t count) {
		D_ASSERT(source.GetType().id() == LogicalTypeId::POINTER && target.GetType().id() == LogicalTypeId::POINTER);
		auto sdata = FlatVector::GetData<const STATE_TYPE *>(source);
		auto tdata = FlatVector::GetData<STATE_TYPE *>(target);

		for (idx_t i = 0; i < count; i++) {
			OP::template Combine<STATE_TYPE, OP>(*sdata[i], *tdata[i], aggr_input_data);
		}
	}